

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixOpen(sqlite3_vfs *pVfs,char *zPath,sqlite3_file *pFile,int flags,int *pOutFlags)

{
  byte *pbVar1;
  uint uVar2;
  bool bVar3;
  pid_t pVar4;
  ulong uVar5;
  sqlite3_io_methods *psVar6;
  __pid_t _Var7;
  int iVar8;
  unixInodeInfo *puVar9;
  sqlite3_io_methods *psVar10;
  size_t sVar11;
  sqlite3_mutex *psVar12;
  int *piVar13;
  sqlite3_io_methods *psVar14;
  UnixUnusedFd **ppUVar15;
  uint *puVar16;
  char *pcVar17;
  uint uVar18;
  mode_t m;
  int iVar19;
  dev_t *pdVar20;
  uint uVar21;
  int iVar22;
  long in_FS_OFFSET;
  bool bVar23;
  undefined1 auVar24 [16];
  unixFileId fileId;
  char zTmpname [514];
  stat sStat;
  uint local_52c;
  uint local_514;
  char local_4e8;
  char cStack_4e7;
  char cStack_4e6;
  char cStack_4e5;
  char cStack_4e4;
  char cStack_4e3;
  char cStack_4e2;
  char cStack_4e1;
  char cStack_4e0;
  char cStack_4df;
  char cStack_4de;
  char cStack_4dd;
  char cStack_4dc;
  char cStack_4db;
  char cStack_4da;
  char cStack_4d9;
  uint local_4d0;
  uint local_4cc;
  uint local_4c8;
  dev_t local_458;
  u64 local_450;
  undefined1 uStack_249;
  undefined8 local_248;
  _func_int_sqlite3_file_ptr *p_Stack_240;
  uint local_230;
  uint local_22c;
  uint local_228;
  long local_38;
  
  pVar4 = randomnessPid;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar21 = flags & 0xffffff00;
  if (((flags & 4U) == 0) ||
     (((bVar3 = true, uVar21 != 0x800 && (uVar21 != 0x4000)) && (uVar21 != 0x80000)))) {
    bVar3 = false;
  }
  _Var7 = getpid();
  if (pVar4 != _Var7) {
    randomnessPid = getpid();
    sqlite3_randomness(0,(void *)0x0);
  }
  *(undefined1 (*) [16])(pFile + 0xc) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 10) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 8) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 6) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 4) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])pFile = (undefined1  [16])0x0;
  pdVar20 = (dev_t *)zPath;
  if (uVar21 == 0x100) {
    iVar8 = (*aSyscall[4].pCurrent)();
    if (iVar8 == 0) {
      if (sqlite3Config.bCoreMutex == 0) {
        psVar12 = (sqlite3_mutex *)0x0;
      }
      else {
        psVar12 = (*sqlite3Config.mutex.xMutexAlloc)(0xb);
      }
      if (psVar12 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(psVar12);
      }
      if (inodeList == (unixInodeInfo *)0x0) {
        psVar10 = (sqlite3_io_methods *)0x0;
      }
      else {
        psVar10 = (sqlite3_io_methods *)0x0;
        puVar9 = inodeList;
        do {
          if (((puVar9->fileId).dev == local_458) && ((puVar9->fileId).ino == local_450)) {
            psVar10 = (sqlite3_io_methods *)puVar9->pUnused;
            bVar23 = psVar10 == (sqlite3_io_methods *)0x0;
            if (!bVar23) {
              if (*(int *)&psVar10->field_0x4 != flags) goto LAB_00115e8f;
              ppUVar15 = &puVar9->pUnused;
              goto LAB_00115eac;
            }
            break;
          }
          puVar9 = puVar9->pNext;
        } while (puVar9 != (unixInodeInfo *)0x0);
      }
      goto LAB_00115a3b;
    }
    psVar10 = (sqlite3_io_methods *)0x0;
    goto LAB_00115a61;
  }
  local_52c = 0xffffffff;
  if (zPath == (char *)0x0) {
    iVar8 = unixGetTempname(pVfs->mxPathname,(char *)&local_458);
    pdVar20 = &local_458;
    if (iVar8 != 0) goto LAB_001160d8;
  }
  goto LAB_00115aaf;
  while (*(int *)&psVar10->field_0x4 != flags) {
LAB_00115e8f:
    psVar14 = psVar10;
    psVar10 = (sqlite3_io_methods *)psVar14->xClose;
    bVar23 = psVar10 == (sqlite3_io_methods *)0x0;
    if (bVar23) goto LAB_00115a3b;
  }
  ppUVar15 = (UnixUnusedFd **)&psVar14->xClose;
LAB_00115eac:
  if (!bVar23) {
    *ppUVar15 = (UnixUnusedFd *)psVar10->xClose;
  }
LAB_00115a3b:
  if (sqlite3Config.bCoreMutex == 0) {
    psVar12 = (sqlite3_mutex *)0x0;
  }
  else {
    psVar12 = (*sqlite3Config.mutex.xMutexAlloc)(0xb);
  }
  if (psVar12 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar12);
  }
LAB_00115a61:
  if (psVar10 == (sqlite3_io_methods *)0x0) {
    iVar8 = sqlite3_initialize();
    if (iVar8 == 0) {
      psVar10 = (sqlite3_io_methods *)sqlite3Malloc(0x10);
    }
    else {
      psVar10 = (sqlite3_io_methods *)0x0;
    }
    local_52c = 0xffffffff;
    if (psVar10 != (sqlite3_io_methods *)0x0) goto LAB_00115a94;
    local_52c = 0xffffffff;
    bVar23 = false;
  }
  else {
    local_52c = psVar10->iVersion;
LAB_00115a94:
    pFile[6].pMethods = psVar10;
    bVar23 = true;
  }
  iVar8 = 7;
  if (!bVar23) goto LAB_001160d8;
LAB_00115aaf:
  uVar18 = flags & 8;
  local_514 = flags & 1;
  iVar19 = (flags & 4U) * 0x10;
  iVar8 = iVar19 + 0x20080;
  if ((flags & 0x10U) == 0) {
    iVar8 = iVar19;
  }
  uVar2 = iVar8 + (flags & 2U);
  if ((int)local_52c < 0) {
    if ((flags & 0x80800U) == 0) {
      if (uVar18 == 0) {
        m = 0;
        if ((flags & 0x40U) != 0) {
          pcVar17 = sqlite3_uri_parameter((char *)pdVar20,"modeof");
          m = 0;
          local_4cc = 0;
          local_4c8 = 0;
          iVar8 = 0;
          if (pcVar17 != (char *)0x0) {
            iVar8 = (*aSyscall[4].pCurrent)();
            local_4cc = local_22c;
            local_4c8 = local_228;
            goto joined_r0x00115fc6;
          }
          goto LAB_00115d96;
        }
      }
      else {
        m = 0x180;
      }
      local_4cc = 0;
      local_4c8 = 0;
      iVar8 = 0;
    }
    else {
      if (pdVar20 == (dev_t *)0x0) {
        uVar5 = 0;
      }
      else {
        sVar11 = strlen((char *)pdVar20);
        uVar5 = (ulong)((uint)sVar11 & 0x3fffffff);
      }
      do {
        sVar11 = uVar5;
        uVar5 = sVar11 - 1;
      } while (*(char *)((long)pdVar20 + (sVar11 - 1)) != '-');
      memcpy(&local_248,pdVar20,sVar11 - 1);
      (&uStack_249)[sVar11] = 0;
      iVar8 = (*aSyscall[4].pCurrent)();
      local_230 = local_4d0;
joined_r0x00115fc6:
      if (iVar8 == 0) {
        m = local_230 & 0x1ff;
        iVar8 = 0;
      }
      else {
        iVar8 = 0x70a;
        m = 0;
        local_4cc = 0;
        local_4c8 = 0;
      }
    }
LAB_00115d96:
    iVar22 = 1;
    iVar19 = iVar8;
    if (iVar8 == 0) {
      local_52c = robust_open((char *)pdVar20,uVar2,m);
      if ((((int)local_52c < 0) && (piVar13 = __errno_location(), (flags & 2U) != 0)) &&
         (*piVar13 != 0x15)) {
        flags = (flags & 0xfffffff8U) + 1;
        local_52c = robust_open((char *)pdVar20,uVar2 & 0x20080,m);
        local_514 = 1;
      }
      if ((int)local_52c < 0) {
        sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0x8d83,
                    "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
        puVar16 = (uint *)__errno_location();
        if (pdVar20 == (dev_t *)0x0) {
          pdVar20 = (dev_t *)0x18b5cb;
        }
        sqlite3_log(0xe,"os_unix.c:%d: (%d) %s(%s) - %s",0x8d83,(ulong)*puVar16,"open",pdVar20,"");
        iVar22 = 2;
        iVar8 = 7;
        iVar19 = 0xe;
      }
      else {
        iVar8 = 7;
        if ((flags & 0x80800U) == 0) {
          iVar22 = 0;
          iVar19 = 0;
        }
        else {
          iVar19 = (*aSyscall[0x15].pCurrent)();
          if (iVar19 == 0) {
            (*aSyscall[0x14].pCurrent)((ulong)local_52c,(ulong)local_4cc,(ulong)local_4c8);
          }
          iVar22 = 0;
          iVar19 = 0;
        }
      }
    }
    if (iVar22 != 2) {
      if (iVar22 != 0) goto LAB_001160d8;
      goto LAB_00115af3;
    }
  }
  else {
LAB_00115af3:
    if (pOutFlags != (int *)0x0) {
      *pOutFlags = flags;
    }
    psVar10 = pFile[6].pMethods;
    if (psVar10 != (sqlite3_io_methods *)0x0) {
      psVar10->iVersion = local_52c;
      *(int *)&psVar10->field_0x4 = flags;
    }
    if (uVar18 != 0) {
      (*aSyscall[0x10].pCurrent)();
    }
    uVar2 = uVar18 * 4 + 2;
    if (local_514 == 0) {
      uVar2 = uVar18 * 4;
    }
    uVar18 = uVar2 + 0x80;
    if (uVar21 == 0x100) {
      uVar18 = uVar2;
    }
    uVar21 = uVar18 | 8;
    if (!bVar3) {
      uVar21 = uVar18;
    }
    *(uint *)&pFile[3].pMethods = local_52c;
    pFile[1].pMethods = (sqlite3_io_methods *)pVfs;
    pFile[7].pMethods = (sqlite3_io_methods *)zPath;
    *(ushort *)((long)&pFile[3].pMethods + 6) = (ushort)(flags & 0x40U) | (ushort)uVar21 & 0xff;
    pFile[0xc].pMethods = (sqlite3_io_methods *)sqlite3Config.szMmap;
    pcVar17 = (char *)0x0;
    if ((flags & 0x40U) != 0 || (uVar21 & 0x40) != 0) {
      pcVar17 = zPath;
    }
    iVar8 = sqlite3_uri_boolean(pcVar17,"psow",1);
    if (iVar8 != 0) {
      pbVar1 = (byte *)((long)&pFile[3].pMethods + 6);
      *pbVar1 = *pbVar1 | 0x10;
    }
    iVar8 = strcmp(pVfs->zName,"unix-excl");
    if (iVar8 == 0) {
      pbVar1 = (byte *)((long)&pFile[3].pMethods + 6);
      *pbVar1 = *pbVar1 | 1;
    }
    if ((char)uVar21 < '\0') {
      psVar10 = &nolockIoMethods;
    }
    else {
      psVar10 = (sqlite3_io_methods *)(**pVfs->pAppData)(zPath,pFile);
    }
    if (psVar10 == &posixIoMethods) {
      if (sqlite3Config.bCoreMutex == 0) {
        psVar12 = (sqlite3_mutex *)0x0;
      }
      else {
        psVar12 = (*sqlite3Config.mutex.xMutexAlloc)(0xb);
      }
      if (psVar12 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(psVar12);
      }
      iVar8 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&pFile[3].pMethods,&local_248);
      psVar14 = (sqlite3_io_methods *)inodeList;
      if (iVar8 == 0) {
        for (; psVar14 != (sqlite3_io_methods *)0x0; psVar14 = (sqlite3_io_methods *)psVar14->xLock)
        {
          local_4e8 = (char)local_248;
          cStack_4e7 = (char)((ulong)local_248 >> 8);
          cStack_4e6 = (char)((ulong)local_248 >> 0x10);
          cStack_4e5 = (char)((ulong)local_248 >> 0x18);
          cStack_4e4 = (char)((ulong)local_248 >> 0x20);
          cStack_4e3 = (char)((ulong)local_248 >> 0x28);
          cStack_4e2 = (char)((ulong)local_248 >> 0x30);
          cStack_4e1 = (char)((ulong)local_248 >> 0x38);
          cStack_4e0 = (char)p_Stack_240;
          cStack_4df = (char)((ulong)p_Stack_240 >> 8);
          cStack_4de = (char)((ulong)p_Stack_240 >> 0x10);
          cStack_4dd = (char)((ulong)p_Stack_240 >> 0x18);
          cStack_4dc = (char)((ulong)p_Stack_240 >> 0x20);
          cStack_4db = (char)((ulong)p_Stack_240 >> 0x28);
          cStack_4da = (char)((ulong)p_Stack_240 >> 0x30);
          cStack_4d9 = (char)((ulong)p_Stack_240 >> 0x38);
          auVar24[0] = -((char)((unixFileId *)&psVar14->iVersion)->dev == local_4e8);
          auVar24[1] = -(*(char *)((long)&((unixFileId *)&psVar14->iVersion)->dev + 1) == cStack_4e7
                        );
          auVar24[2] = -(*(char *)((long)&((unixFileId *)&psVar14->iVersion)->dev + 2) == cStack_4e6
                        );
          auVar24[3] = -(*(char *)((long)&((unixFileId *)&psVar14->iVersion)->dev + 3) == cStack_4e5
                        );
          auVar24[4] = -(psVar14->field_0x4 == cStack_4e4);
          auVar24[5] = -(psVar14->field_0x5 == cStack_4e3);
          auVar24[6] = -(psVar14->field_0x6 == cStack_4e2);
          auVar24[7] = -(psVar14->field_0x7 == cStack_4e1);
          auVar24[8] = -(*(char *)&psVar14->xClose == cStack_4e0);
          auVar24[9] = -(*(char *)((long)&psVar14->xClose + 1) == cStack_4df);
          auVar24[10] = -(*(char *)((long)&psVar14->xClose + 2) == cStack_4de);
          auVar24[0xb] = -(*(char *)((long)&psVar14->xClose + 3) == cStack_4dd);
          auVar24[0xc] = -(*(char *)((long)&psVar14->xClose + 4) == cStack_4dc);
          auVar24[0xd] = -(*(char *)((long)&psVar14->xClose + 5) == cStack_4db);
          auVar24[0xe] = -(*(char *)((long)&psVar14->xClose + 6) == cStack_4da);
          auVar24[0xf] = -(*(char *)((long)&psVar14->xClose + 7) == cStack_4d9);
          if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar24[0xf] >> 7) << 0xf) == 0xffff) {
            *(int *)&psVar14->xWrite = *(int *)&psVar14->xWrite + 1;
            psVar6 = (sqlite3_io_methods *)inodeList;
            goto LAB_00116053;
          }
        }
        iVar8 = sqlite3_initialize();
        if (iVar8 == 0) {
          psVar14 = (sqlite3_io_methods *)sqlite3Malloc(0x48);
        }
        else {
          psVar14 = (sqlite3_io_methods *)0x0;
        }
        if (psVar14 == (sqlite3_io_methods *)0x0) {
          iVar19 = 7;
          goto LAB_00115cca;
        }
        *(undefined1 (*) [16])&psVar14->xFileSize = (undefined1  [16])0x0;
        *(undefined1 (*) [16])&psVar14->xTruncate = (undefined1  [16])0x0;
        psVar14->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
        psVar14->xWrite = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
        psVar14->xUnlock = (_func_int_sqlite3_file_ptr_int *)0x0;
        *(undefined8 *)psVar14 = local_248;
        psVar14->xClose = p_Stack_240;
        *(int *)&psVar14->xWrite = 1;
        psVar14->xLock = (_func_int_sqlite3_file_ptr_int *)inodeList;
        psVar14->xUnlock = (_func_int_sqlite3_file_ptr_int *)0x0;
        psVar6 = psVar14;
        if (inodeList != (unixInodeInfo *)0x0) {
          inodeList->pPrev = (unixInodeInfo *)psVar14;
        }
LAB_00116053:
        inodeList = (unixInodeInfo *)psVar6;
        pFile[2].pMethods = psVar14;
        iVar19 = 0;
        bVar3 = true;
      }
      else {
        piVar13 = __errno_location();
        *(int *)&pFile[4].pMethods = *piVar13;
        iVar19 = 10;
LAB_00115cca:
        bVar3 = false;
      }
      if (!bVar3) {
        robust_close((unixFile *)pFile,local_52c,0x8b95);
        local_52c = 0xffffffff;
      }
      if (sqlite3Config.bCoreMutex == 0) {
        psVar12 = (sqlite3_mutex *)0x0;
      }
      else {
        psVar12 = (*sqlite3Config.mutex.xMutexAlloc)(0xb);
      }
      if (psVar12 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar12);
      }
    }
    else {
      iVar19 = 0;
      if (psVar10 == &dotlockIoMethods) {
        sVar11 = strlen(zPath);
        iVar22 = (int)sVar11 + 6;
        iVar8 = sqlite3_initialize();
        if (iVar8 == 0) {
          psVar14 = (sqlite3_io_methods *)sqlite3Malloc((long)iVar22);
        }
        else {
          psVar14 = (sqlite3_io_methods *)0x0;
        }
        if (psVar14 == (sqlite3_io_methods *)0x0) {
          iVar19 = 7;
        }
        else {
          iVar19 = 0;
          sqlite3_snprintf(iVar22,(char *)psVar14,"%s.lock",zPath);
        }
        pFile[5].pMethods = psVar14;
      }
    }
    *(undefined4 *)&pFile[4].pMethods = 0;
    if (iVar19 == 0) {
      pFile->pMethods = psVar10;
      verifyDbFile((unixFile *)pFile);
    }
    else if (-1 < (int)local_52c) {
      robust_close((unixFile *)pFile,local_52c,0x8bea);
    }
  }
  iVar8 = iVar19;
  if (iVar8 != 0) {
    sqlite3_free(pFile[6].pMethods);
  }
LAB_001160d8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar8;
  }
  __stack_chk_fail();
}

Assistant:

static int unixOpen(
  sqlite3_vfs *pVfs,           /* The VFS for which this is the xOpen method */
  const char *zPath,           /* Pathname of file to be opened */
  sqlite3_file *pFile,         /* The file descriptor to be filled in */
  int flags,                   /* Input flags to control the opening */
  int *pOutFlags               /* Output flags returned to SQLite core */
){
  unixFile *p = (unixFile *)pFile;
  int fd = -1;                   /* File descriptor returned by open() */
  int openFlags = 0;             /* Flags to pass to open() */
  int eType = flags&0xFFFFFF00;  /* Type of file to open */
  int noLock;                    /* True to omit locking primitives */
  int rc = SQLITE_OK;            /* Function Return Code */
  int ctrlFlags = 0;             /* UNIXFILE_* flags */

  int isExclusive  = (flags & SQLITE_OPEN_EXCLUSIVE);
  int isDelete     = (flags & SQLITE_OPEN_DELETEONCLOSE);
  int isCreate     = (flags & SQLITE_OPEN_CREATE);
  int isReadonly   = (flags & SQLITE_OPEN_READONLY);
  int isReadWrite  = (flags & SQLITE_OPEN_READWRITE);
#if SQLITE_ENABLE_LOCKING_STYLE
  int isAutoProxy  = (flags & SQLITE_OPEN_AUTOPROXY);
#endif
#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  struct statfs fsInfo;
#endif

  /* If creating a master or main-file journal, this function will open
  ** a file-descriptor on the directory too. The first time unixSync()
  ** is called the directory file descriptor will be fsync()ed and close()d.
  */
  int syncDir = (isCreate && (
        eType==SQLITE_OPEN_MASTER_JOURNAL 
     || eType==SQLITE_OPEN_MAIN_JOURNAL 
     || eType==SQLITE_OPEN_WAL
  ));

  /* If argument zPath is a NULL pointer, this function is required to open
  ** a temporary file. Use this buffer to store the file name in.
  */
  char zTmpname[MAX_PATHNAME+2];
  const char *zName = zPath;

  /* Check the following statements are true: 
  **
  **   (a) Exactly one of the READWRITE and READONLY flags must be set, and 
  **   (b) if CREATE is set, then READWRITE must also be set, and
  **   (c) if EXCLUSIVE is set, then CREATE must also be set.
  **   (d) if DELETEONCLOSE is set, then CREATE must also be set.
  */
  assert((isReadonly==0 || isReadWrite==0) && (isReadWrite || isReadonly));
  assert(isCreate==0 || isReadWrite);
  assert(isExclusive==0 || isCreate);
  assert(isDelete==0 || isCreate);

  /* The main DB, main journal, WAL file and master journal are never 
  ** automatically deleted. Nor are they ever temporary files.  */
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_DB );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MASTER_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_WAL );

  /* Assert that the upper layer has set one of the "file-type" flags. */
  assert( eType==SQLITE_OPEN_MAIN_DB      || eType==SQLITE_OPEN_TEMP_DB 
       || eType==SQLITE_OPEN_MAIN_JOURNAL || eType==SQLITE_OPEN_TEMP_JOURNAL 
       || eType==SQLITE_OPEN_SUBJOURNAL   || eType==SQLITE_OPEN_MASTER_JOURNAL 
       || eType==SQLITE_OPEN_TRANSIENT_DB || eType==SQLITE_OPEN_WAL
  );

  /* Detect a pid change and reset the PRNG.  There is a race condition
  ** here such that two or more threads all trying to open databases at
  ** the same instant might all reset the PRNG.  But multiple resets
  ** are harmless.
  */
  if( randomnessPid!=osGetpid(0) ){
    randomnessPid = osGetpid(0);
    sqlite3_randomness(0,0);
  }

  memset(p, 0, sizeof(unixFile));

  if( eType==SQLITE_OPEN_MAIN_DB ){
    UnixUnusedFd *pUnused;
    pUnused = findReusableFd(zName, flags);
    if( pUnused ){
      fd = pUnused->fd;
    }else{
      pUnused = sqlite3_malloc64(sizeof(*pUnused));
      if( !pUnused ){
        return SQLITE_NOMEM_BKPT;
      }
    }
    p->pUnused = pUnused;

    /* Database filenames are double-zero terminated if they are not
    ** URIs with parameters.  Hence, they can always be passed into
    ** sqlite3_uri_parameter(). */
    assert( (flags & SQLITE_OPEN_URI) || zName[strlen(zName)+1]==0 );

  }else if( !zName ){
    /* If zName is NULL, the upper layer is requesting a temp file. */
    assert(isDelete && !syncDir);
    rc = unixGetTempname(pVfs->mxPathname, zTmpname);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    zName = zTmpname;

    /* Generated temporary filenames are always double-zero terminated
    ** for use by sqlite3_uri_parameter(). */
    assert( zName[strlen(zName)+1]==0 );
  }

  /* Determine the value of the flags parameter passed to POSIX function
  ** open(). These must be calculated even if open() is not called, as
  ** they may be stored as part of the file handle and used by the 
  ** 'conch file' locking functions later on.  */
  if( isReadonly )  openFlags |= O_RDONLY;
  if( isReadWrite ) openFlags |= O_RDWR;
  if( isCreate )    openFlags |= O_CREAT;
  if( isExclusive ) openFlags |= (O_EXCL|O_NOFOLLOW);
  openFlags |= (O_LARGEFILE|O_BINARY);

  if( fd<0 ){
    mode_t openMode;              /* Permissions to create file with */
    uid_t uid;                    /* Userid for the file */
    gid_t gid;                    /* Groupid for the file */
    rc = findCreateFileMode(zName, flags, &openMode, &uid, &gid);
    if( rc!=SQLITE_OK ){
      assert( !p->pUnused );
      assert( eType==SQLITE_OPEN_WAL || eType==SQLITE_OPEN_MAIN_JOURNAL );
      return rc;
    }
    fd = robust_open(zName, openFlags, openMode);
    OSTRACE(("OPENX   %-3d %s 0%o\n", fd, zName, openFlags));
    assert( !isExclusive || (openFlags & O_CREAT)!=0 );
    if( fd<0 && errno!=EISDIR && isReadWrite ){
      /* Failed to open the file for read/write access. Try read-only. */
      flags &= ~(SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE);
      openFlags &= ~(O_RDWR|O_CREAT);
      flags |= SQLITE_OPEN_READONLY;
      openFlags |= O_RDONLY;
      isReadonly = 1;
      fd = robust_open(zName, openFlags, openMode);
    }
    if( fd<0 ){
      rc = unixLogError(SQLITE_CANTOPEN_BKPT, "open", zName);
      goto open_finished;
    }

    /* If this process is running as root and if creating a new rollback
    ** journal or WAL file, set the ownership of the journal or WAL to be
    ** the same as the original database.
    */
    if( flags & (SQLITE_OPEN_WAL|SQLITE_OPEN_MAIN_JOURNAL) ){
      robustFchown(fd, uid, gid);
    }
  }
  assert( fd>=0 );
  if( pOutFlags ){
    *pOutFlags = flags;
  }

  if( p->pUnused ){
    p->pUnused->fd = fd;
    p->pUnused->flags = flags;
  }

  if( isDelete ){
#if OS_VXWORKS
    zPath = zName;
#elif defined(SQLITE_UNLINK_AFTER_CLOSE)
    zPath = sqlite3_mprintf("%s", zName);
    if( zPath==0 ){
      robust_close(p, fd, __LINE__);
      return SQLITE_NOMEM_BKPT;
    }
#else
    osUnlink(zName);
#endif
  }
#if SQLITE_ENABLE_LOCKING_STYLE
  else{
    p->openFlags = openFlags;
  }
#endif
  
#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  if( fstatfs(fd, &fsInfo) == -1 ){
    storeLastErrno(p, errno);
    robust_close(p, fd, __LINE__);
    return SQLITE_IOERR_ACCESS;
  }
  if (0 == strncmp("msdos", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
  if (0 == strncmp("exfat", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
#endif

  /* Set up appropriate ctrlFlags */
  if( isDelete )                ctrlFlags |= UNIXFILE_DELETE;
  if( isReadonly )              ctrlFlags |= UNIXFILE_RDONLY;
  noLock = eType!=SQLITE_OPEN_MAIN_DB;
  if( noLock )                  ctrlFlags |= UNIXFILE_NOLOCK;
  if( syncDir )                 ctrlFlags |= UNIXFILE_DIRSYNC;
  if( flags & SQLITE_OPEN_URI ) ctrlFlags |= UNIXFILE_URI;

#if SQLITE_ENABLE_LOCKING_STYLE
#if SQLITE_PREFER_PROXY_LOCKING
  isAutoProxy = 1;
#endif
  if( isAutoProxy && (zPath!=NULL) && (!noLock) && pVfs->xOpen ){
    char *envforce = getenv("SQLITE_FORCE_PROXY_LOCKING");
    int useProxy = 0;

    /* SQLITE_FORCE_PROXY_LOCKING==1 means force always use proxy, 0 means 
    ** never use proxy, NULL means use proxy for non-local files only.  */
    if( envforce!=NULL ){
      useProxy = atoi(envforce)>0;
    }else{
      useProxy = !(fsInfo.f_flags&MNT_LOCAL);
    }
    if( useProxy ){
      rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);
      if( rc==SQLITE_OK ){
        rc = proxyTransformUnixFile((unixFile*)pFile, ":auto:");
        if( rc!=SQLITE_OK ){
          /* Use unixClose to clean up the resources added in fillInUnixFile 
          ** and clear all the structure's references.  Specifically, 
          ** pFile->pMethods will be NULL so sqlite3OsClose will be a no-op 
          */
          unixClose(pFile);
          return rc;
        }
      }
      goto open_finished;
    }
  }
#endif
  
  rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);

open_finished:
  if( rc!=SQLITE_OK ){
    sqlite3_free(p->pUnused);
  }
  return rc;
}